

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall trackerboy::apu::Mixer::setBuffer(Mixer *this,size_t samples)

{
  ulong uVar1;
  float *pfVar2;
  float *__s;
  ulong __n;
  
  uVar1 = samples * 2 + 0x20;
  if (uVar1 != this->mBuffersize) {
    __n = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
    __s = (float *)operator_new__(__n);
    memset(__s,0,__n);
    pfVar2 = (this->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (this->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
    if (pfVar2 != (float *)0x0) {
      operator_delete__(pfVar2);
    }
    this->mBuffersize = uVar1;
  }
  this->mWriteIndex = 0;
  (this->mAccumulators)._M_elems[0].sum = 0.0;
  (this->mAccumulators)._M_elems[0].highpass = 0.0;
  (this->mAccumulators)._M_elems[1].sum = 0.0;
  (this->mAccumulators)._M_elems[1].highpass = 0.0;
  this->mSampleOffset = 0.0;
  if (uVar1 != 0) {
    memset((this->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl,0,uVar1 * 4);
    return;
  }
  return;
}

Assistant:

void Mixer::setBuffer(size_t samples) {
    auto size = (samples + TU::STEP_WIDTH) * 2;
    if (size != mBuffersize) {
        mBuffer = std::make_unique<float[]>(size);
        mBuffersize = size;
    }
    clear();
}